

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 SyZipExtractFromBuf(SyArchive *pArch,char *zBuf,sxu32 nLen)

{
  sxu32 *psVar1;
  SyArchiveEntry **ppSVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  SyArchiveEntry *pSVar7;
  ushort uVar8;
  ushort uVar9;
  long lVar10;
  sxi32 sVar11;
  uint uVar12;
  uint uVar13;
  sxu32 sVar14;
  SyArchiveEntry *__s;
  SyArchiveEntry **ppSVar15;
  SyArchiveEntry **ppSVar16;
  int *piVar17;
  int *piVar18;
  SyArchiveEntry **ppSVar19;
  long lVar20;
  ushort uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  SyArchiveEntry *pSVar25;
  sxu32 *psVar26;
  sxu32 sVar27;
  char *pcVar28;
  sxu32 sVar29;
  int local_68;
  SyString local_40;
  
  sVar11 = -0x18;
  if (0x61 < nLen) {
    piVar18 = (int *)(zBuf + (nLen - 0x16));
    sVar11 = SyMemcmp(piVar18,"PK\x05\x06",4);
    piVar17 = piVar18;
    if (sVar11 != 0) {
      piVar17 = (int *)(zBuf + (nLen - 0x16));
      lVar10 = 1;
      do {
        lVar20 = lVar10;
        piVar17 = (int *)((long)piVar17 + -1);
        if ((piVar17 <= zBuf) || (0x8014 < (int)lVar20 + 0x16U)) break;
        sVar11 = SyMemcmp(piVar17,"PK\x05\x06",4);
        lVar10 = lVar20 + 1;
      } while (sVar11 != 0);
      piVar18 = (int *)((long)piVar18 - lVar20);
    }
    sVar11 = -0x18;
    if ((*piVar17 == 0x6054b50) &&
       (*(short *)&pArch->nEntry = (short)piVar17[2], pArch->nEntry < 0x8000)) {
      sVar27 = piVar17[3];
      pArch->nCentralSize = sVar27;
      if (-1 < (long)(int)sVar27) {
        uVar12 = piVar17[4];
        pArch->nCentralOfft = uVar12;
        piVar17 = (int *)((long)piVar17 - (long)(int)sVar27);
        if ((piVar17 <= zBuf) || (sVar11 = SyMemcmp(piVar17,"PK\x01\x02",4), sVar11 != 0)) {
          if (nLen <= uVar12) {
            return -0x18;
          }
          piVar17 = (int *)(zBuf + uVar12);
          sVar11 = SyMemcmp(piVar17,"PK\x01\x02",4);
          if (sVar11 != 0) {
            return -0x18;
          }
        }
        uVar12 = (int)piVar18 - (int)piVar17;
        if (uVar12 != 0) {
          psVar1 = &pArch->nLoaded;
          ppSVar2 = &pArch->pList;
          uVar24 = 0;
          piVar18 = piVar17;
          while (__s = (SyArchiveEntry *)SyMemBackendPoolAlloc(pArch->pAllocator,0xa8),
                __s != (SyArchiveEntry *)0x0) {
            uVar21 = 0;
            memset(__s,0,0xa8);
            __s->nMagic = 0xdead635a;
            uVar23 = 0;
            uVar13 = 0;
            local_68 = (int)uVar24;
            if (*piVar18 == 0x2014b50) {
              *(short *)&(__s->sFileName).nByte = (short)piVar18[7];
              uVar23 = (__s->sFileName).nByte;
              if (0x7fff < (ulong)uVar23) {
                uVar21 = 0;
                uVar13 = 0;
                goto LAB_0013f37c;
              }
              uVar21 = *(ushort *)((long)piVar18 + 0x1e);
              __s->nExtra = uVar21;
              uVar13 = (uint)*(ushort *)(piVar18 + 8);
              __s->nComprMeth = *(sxu16 *)((long)piVar18 + 10);
              bVar3 = (byte)*(ushort *)(piVar18 + 3);
              bVar4 = *(byte *)((long)piVar18 + 0xd);
              uVar9 = *(ushort *)(piVar18 + 3);
              bVar5 = *(byte *)((long)piVar18 + 0xe);
              bVar6 = *(byte *)((long)piVar18 + 0xf);
              uVar8 = *(ushort *)((long)piVar18 + 0xe);
              (__s->sFmt).tm_isdst = 0;
              (__s->sFmt).tm_year = (bVar6 >> 1) + 0x7bc;
              (__s->sFmt).tm_mday = bVar5 & 0x1f;
              (__s->sFmt).tm_hour = (uint)(bVar4 >> 3);
              (__s->sFmt).tm_min = uVar9 >> 5 & 0x3f;
              (__s->sFmt).tm_sec = (uint)bVar3 + (uint)bVar3 & 0x3e;
              (__s->sFmt).tm_mon = (uVar8 >> 5 & 0xf) - 1;
              __s->nCrc = piVar18[4];
              sVar27 = piVar18[6];
              __s->nByte = sVar27;
              if (((int)sVar27 < 0) ||
                 (sVar29 = piVar18[5], __s->nByteCompr = sVar29, (int)sVar29 < 0))
              goto LAB_0013f37c;
              sVar29 = *(sxu32 *)((long)piVar18 + 0x2a);
              __s->nOfft = sVar29;
              if ((long)(int)sVar29 < 0) goto LAB_0013f37c;
              iVar22 = uVar13 + uVar21 + uVar23 + 0x2e;
              pcVar28 = zBuf + (int)sVar29;
              sVar11 = SyMemcmp(pcVar28,"PK\x03\x04",4);
              if (sVar11 != 0) goto LAB_0013f38b;
              __s->nOfft = *(ushort *)(pcVar28 + 0x1a) + sVar29 + (uint)*(ushort *)(pcVar28 + 0x1c)
                           + 0x1e;
              pcVar28 = (char *)((ulong)(local_68 + 0x2e) + (long)piVar17);
              (__s->sFileName).zString = pcVar28;
              if ((uVar23 == 0) ||
                 (((sVar27 == 0 && (pcVar28[(ulong)uVar23 - 1] != '/')) ||
                  (pcVar28 = SyMemBackendStrDup(pArch->pAllocator,pcVar28,uVar23),
                  pcVar28 == (char *)0x0)))) {
                SyMemBackendPoolFree(pArch->pAllocator,__s);
              }
              else {
                (__s->sFileName).zString = pcVar28;
                sVar27 = (__s->sFileName).nByte;
                sVar14 = (*pArch->xHash)(pcVar28,sVar27);
                sVar29 = pArch->nSize;
                pSVar25 = pArch->apHash[sVar29 - 1 & sVar14];
                local_40.zString = pcVar28;
                local_40.nByte = sVar27;
                if (pSVar25 != (SyArchiveEntry *)0x0) {
                  do {
                    if ((sVar14 == pSVar25->nHash) &&
                       (sVar11 = (*pArch->xCmp)(&local_40,&pSVar25->sFileName), sVar11 == 0)) {
                      __s->pNextName = pSVar25->pNextName;
                      pSVar25->pNextName = __s;
                      psVar26 = &pSVar25->nDup;
                      goto LAB_0013f611;
                    }
                    pSVar25 = pSVar25->pNextHash;
                  } while (pSVar25 != (SyArchiveEntry *)0x0);
                  sVar29 = pArch->nSize;
                }
                if (sVar29 * 3 < *psVar1) {
                  sVar27 = sVar29 << 4;
                  ppSVar15 = (SyArchiveEntry **)SyMemBackendAlloc(pArch->pAllocator,sVar27);
                  if (ppSVar15 != (SyArchiveEntry **)0x0) {
                    if (sVar27 != 0) {
                      ppSVar16 = (SyArchiveEntry **)((long)ppSVar15 + (ulong)sVar27);
                      ppSVar19 = ppSVar15;
                      do {
                        *(undefined1 *)ppSVar19 = 0;
                        if (ppSVar16 <= (SyArchiveEntry **)((long)ppSVar19 + 1)) break;
                        *(undefined1 *)((long)ppSVar19 + 1) = 0;
                        if (ppSVar16 <= (SyArchiveEntry **)((long)ppSVar19 + 2)) break;
                        *(undefined1 *)((long)ppSVar19 + 2) = 0;
                        if (ppSVar16 <= (SyArchiveEntry **)((long)ppSVar19 + 3)) break;
                        *(undefined1 *)((long)ppSVar19 + 3) = 0;
                        ppSVar19 = (SyArchiveEntry **)((long)ppSVar19 + 4);
                      } while (ppSVar19 < ppSVar16);
                    }
                    sVar27 = *psVar1;
                    if (sVar27 != 0) {
                      ppSVar19 = ppSVar2;
                      do {
                        pSVar25 = *ppSVar19;
                        pSVar25->pNextHash = (SyArchiveEntry *)0x0;
                        pSVar25->pPrevHash = (SyArchiveEntry *)0x0;
                        uVar23 = pSVar25->nHash & sVar29 * 2 - 1;
                        pSVar7 = ppSVar15[uVar23];
                        pSVar25->pNextHash = pSVar7;
                        if (pSVar7 != (SyArchiveEntry *)0x0) {
                          pSVar7->pPrevHash = pSVar25;
                        }
                        ppSVar15[uVar23] = pSVar25;
                        ppSVar19 = &pSVar25->pNext;
                        sVar27 = sVar27 - 1;
                      } while (sVar27 != 0);
                    }
                    SyMemBackendFree(pArch->pAllocator,pArch->apHash);
                    pArch->apHash = ppSVar15;
                    pArch->nSize = sVar29 * 2;
                  }
                }
                sVar27 = (*pArch->xHash)((__s->sFileName).zString,(__s->sFileName).nByte);
                __s->nHash = sVar27;
                ppSVar15 = pArch->apHash;
                uVar23 = pArch->nSize - 1 & sVar27;
                pSVar25 = ppSVar15[uVar23];
                __s->pNextHash = pSVar25;
                if (pSVar25 != (SyArchiveEntry *)0x0) {
                  pSVar25->pPrevHash = __s;
                }
                ppSVar15[uVar23] = __s;
                pSVar25 = *ppSVar2;
                if (pSVar25 != (SyArchiveEntry *)0x0) {
                  __s->pNext = pSVar25;
                  pSVar25->pPrev = __s;
                }
                *ppSVar2 = __s;
                psVar26 = psVar1;
LAB_0013f611:
                *psVar26 = *psVar26 + 1;
              }
              uVar23 = iVar22 + local_68;
            }
            else {
LAB_0013f37c:
              iVar22 = (uint)uVar21 + uVar13 + uVar23 + 0x2e;
LAB_0013f38b:
              local_40.zString = (char *)((ulong)local_40.zString & 0xffffffff00000000);
              SyMemBackendPoolFree(pArch->pAllocator,__s);
              uVar23 = iVar22 + local_68;
              sVar11 = SyBlobSearch((void *)((long)piVar17 + (ulong)uVar23),uVar12 - uVar23,
                                    "PK\x01\x02",4,(sxu32 *)&local_40);
              if (sVar11 != 0) break;
              uVar23 = uVar23 + (int)local_40.zString;
            }
            uVar24 = (ulong)uVar23;
            if (uVar12 <= uVar23) break;
            piVar18 = (int *)(uVar24 + (long)piVar17);
          }
        }
        pArch->pCursor = pArch->pList;
        sVar11 = (uint)(pArch->nLoaded != 0) * 3 + -3;
      }
    }
  }
  return sVar11;
}

Assistant:

JX9_PRIVATE sxi32 SyZipExtractFromBuf(SyArchive *pArch, const char *zBuf, sxu32 nLen)
 {
 	const unsigned char *zCentral, *zEnd;
 	sxi32 rc;
#if defined(UNTRUST)
 	if( SXARCH_INVALID(pArch) || zBuf == 0 ){
 		return SXERR_INVALID;
 	}
#endif 	
 	/* The miminal size of a zip archive:
 	 * LOCAL_HDR_SZ + CENTRAL_HDR_SZ + END_OF_CENTRAL_HDR_SZ
 	 * 		30				46				22
 	 */
 	 if( nLen < SXZIP_LOCAL_HDRSZ + SXZIP_CENTRAL_HDRSZ + SXZIP_END_CENTRAL_HDRSZ ){
 	 	return SXERR_CORRUPT; /* Don't bother processing return immediately */
 	 }
 	  		
 	zEnd = (unsigned char *)&zBuf[nLen - SXZIP_END_CENTRAL_HDRSZ];
 	/* Find the end of central directory */
 	while( ((sxu32)((unsigned char *)&zBuf[nLen] - zEnd) < (SXZIP_END_CENTRAL_HDRSZ + SXI16_HIGH)) &&
		zEnd > (unsigned char *)zBuf && SyMemcmp(zEnd, "PK\005\006", sizeof(sxu32)) != 0 ){
 		zEnd--;
 	} 	
 	/* Parse the end of central directory */
 	rc = ParseEndOfCentralDirectory(&(*pArch), zEnd);
 	if( rc != SXRET_OK ){
 		return rc;
 	} 	
 	
 	/* Find the starting offset of the central directory */
 	zCentral = &zEnd[-(sxi32)pArch->nCentralSize];
 	if( zCentral <= (unsigned char *)zBuf || SyMemcmp(zCentral, "PK\001\002", sizeof(sxu32)) != 0 ){
 		if( pArch->nCentralOfft >= nLen ){
			/* Corrupted central directory offset */
 			return SXERR_CORRUPT;
 		}
 		zCentral = (unsigned char *)&zBuf[pArch->nCentralOfft];
 		if( SyMemcmp(zCentral, "PK\001\002", sizeof(sxu32)) != 0 ){
 			/* Corrupted zip archive */
 			return SXERR_CORRUPT;
 		}
 		/* Fall thru and extract all valid entries from the central directory */
 	}
 	rc = ZipExtract(&(*pArch), zCentral, (sxu32)(zEnd - zCentral), (void *)zBuf);
 	return rc;
 }